

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O1

void ncnn::convdw3x3s2_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Option *opt)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  void *pvVar14;
  void *pvVar15;
  size_t sVar16;
  size_t sVar17;
  void *pvVar18;
  size_t sVar19;
  size_t sVar20;
  int iVar21;
  int size;
  uint uVar22;
  char *pcVar23;
  char *pcVar24;
  long lVar25;
  long lVar26;
  int *piVar27;
  char *pcVar28;
  int iVar29;
  int iVar30;
  
  iVar10 = top_blob->c;
  if (0 < (long)iVar10) {
    iVar11 = top_blob->w;
    iVar12 = top_blob->h;
    pvVar14 = _kernel->data;
    iVar13 = bottom_blob->w;
    iVar21 = (iVar13 - iVar11) * 2;
    pvVar15 = top_blob->data;
    sVar16 = top_blob->cstep;
    sVar17 = top_blob->elemsize;
    pvVar18 = bottom_blob->data;
    sVar19 = bottom_blob->cstep;
    sVar20 = bottom_blob->elemsize;
    lVar25 = 0;
    do {
      lVar26 = sVar16 * sVar17 * lVar25;
      uVar22 = top_blob->h * top_blob->w;
      if (0 < (int)uVar22) {
        memset((void *)((long)pvVar15 + lVar26),0,(ulong)uVar22 << 2);
      }
      if (0 < iVar12) {
        piVar27 = (int *)(lVar26 + (long)pvVar15);
        lVar26 = lVar25 * 9;
        pcVar23 = (char *)(sVar19 * sVar20 * lVar25 + (long)pvVar18);
        pcVar24 = pcVar23 + (long)iVar13 * 2;
        pcVar28 = pcVar23 + iVar13;
        iVar29 = 0;
        do {
          iVar30 = iVar11 + 1;
          if (0 < iVar11) {
            do {
              cVar7 = *pcVar23;
              pcVar1 = pcVar23 + 1;
              pcVar2 = pcVar23 + 2;
              pcVar23 = pcVar23 + 2;
              cVar8 = *pcVar28;
              pcVar3 = pcVar28 + 1;
              pcVar4 = pcVar28 + 2;
              pcVar28 = pcVar28 + 2;
              cVar9 = *pcVar24;
              pcVar5 = pcVar24 + 1;
              pcVar6 = pcVar24 + 2;
              pcVar24 = pcVar24 + 2;
              *piVar27 = (int)*(char *)((long)pvVar14 + lVar26 + 7) * (int)*pcVar5 +
                         (int)*(char *)((long)pvVar14 + lVar26 + 6) * (int)cVar9 +
                         (int)*(char *)((long)pvVar14 + lVar26 + 5) * (int)*pcVar4 +
                         (int)*(char *)((long)pvVar14 + lVar26 + 4) * (int)*pcVar3 +
                         (int)*(char *)((long)pvVar14 + lVar26 + 3) * (int)cVar8 +
                         (int)*(char *)((long)pvVar14 + lVar26 + 2) * (int)*pcVar2 +
                         (int)*(char *)((long)pvVar14 + lVar26 + 1) * (int)*pcVar1 +
                         (int)*(char *)((long)pvVar14 + lVar26) * (int)cVar7 + *piVar27 +
                         (int)*(char *)((long)pvVar14 + lVar26 + 8) * (int)*pcVar6;
              piVar27 = piVar27 + 1;
              iVar30 = iVar30 + -1;
            } while (1 < iVar30);
          }
          pcVar23 = pcVar23 + iVar21;
          pcVar28 = pcVar28 + iVar21;
          pcVar24 = pcVar24 + iVar21;
          iVar29 = iVar29 + 1;
        } while (iVar29 != iVar12);
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 != iVar10);
  }
  return;
}

Assistant:

static void convdw3x3s2_int8_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2 * outw + w;

    const signed char *kernel = _kernel;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        out.fill(0);

        const signed char *kernel0 = (const signed char *)kernel + p * 9;

        int *outptr = out;

        const signed char *img0 = bottom_blob.channel(p);

        const signed char *r0 = img0;
        const signed char *r1 = img0 + w;
        const signed char *r2 = img0 + w * 2;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr += sum;

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}